

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# full_toc.c
# Opt level: O0

int cueify_full_toc_deserialize(cueify_full_toc *t,uint8_t *buffer,size_t size)

{
  byte bVar1;
  ushort uVar2;
  byte *pbVar3;
  byte *pbStack_40;
  uint8_t offset;
  uint8_t *bp;
  uint16_t toc_length;
  cueify_full_toc_private *toc;
  size_t size_local;
  uint8_t *buffer_local;
  cueify_full_toc *t_local;
  
  if ((t == (cueify_full_toc *)0x0) || (buffer == (uint8_t *)0x0)) {
    t_local._4_4_ = 3;
  }
  else if (size < 4) {
    t_local._4_4_ = 6;
  }
  else {
    uVar2 = CONCAT11(*buffer,buffer[1]);
    if (size - 2 < (ulong)uVar2) {
      t_local._4_4_ = 6;
    }
    else if ((int)(uVar2 - 2) % 0xb == 0) {
      memset(t,0,0x106c);
      *(uint8_t *)t = buffer[2];
      *(uint8_t *)((long)t + 1) = buffer[3];
      *(undefined1 *)((long)t + 3) = 0;
      *(undefined1 *)((long)t + 2) = 0;
      pbStack_40 = buffer + 4;
      while (pbStack_40 < buffer + (long)(int)(uint)uVar2 + 2) {
        if ((int)(uint)pbStack_40[1] >> 4 == 5) {
          pbStack_40 = pbStack_40 + 0xb;
        }
        else {
          bVar1 = pbStack_40[3];
          if (bVar1 < 100) {
            *(byte *)((long)t + (ulong)bVar1 * 9 + 4) = *pbStack_40;
            *(char *)((long)t + (ulong)bVar1 * 9 + 5) = (char)((int)(uint)pbStack_40[1] >> 4);
            *(byte *)((long)t + (ulong)bVar1 * 9 + 6) = pbStack_40[1] & 0xf;
            *(byte *)((long)t + (ulong)bVar1 * 9 + 7) = pbStack_40[4];
            *(byte *)((long)t + (ulong)bVar1 * 9 + 8) = pbStack_40[5];
            *(byte *)((long)t + (ulong)bVar1 * 9 + 9) = pbStack_40[6];
            *(byte *)((long)t + (ulong)bVar1 * 9 + 10) = pbStack_40[8];
            pbVar3 = pbStack_40 + 10;
            *(byte *)((long)t + (ulong)bVar1 * 9 + 0xb) = pbStack_40[9];
            pbStack_40 = pbStack_40 + 0xb;
            *(byte *)((long)t + (ulong)bVar1 * 9 + 0xc) = *pbVar3;
          }
          else if (bVar1 == 0xa0) {
            bVar1 = *pbStack_40;
            *(byte *)((long)t + (ulong)bVar1 * 0x21 + 0x397) = bVar1;
            *(char *)((long)t + (ulong)bVar1 * 0x21 + 0x398) = (char)((int)(uint)pbStack_40[1] >> 4)
            ;
            *(byte *)((long)t + (ulong)bVar1 * 0x21 + 0x399) = pbStack_40[1] & 0xf;
            *(byte *)((long)t + (ulong)bVar1 * 0x21 + 0x39a) = pbStack_40[4];
            *(byte *)((long)t + (ulong)bVar1 * 0x21 + 0x39b) = pbStack_40[5];
            *(byte *)((long)t + (ulong)bVar1 * 0x21 + 0x39c) = pbStack_40[6];
            *(byte *)((long)t + (ulong)bVar1 * 0x21 + 0x39d) = pbStack_40[8];
            *(undefined1 *)((long)t + (ulong)bVar1 * 0x21 + 0x388) =
                 *(undefined1 *)((long)t + (ulong)bVar1 * 0x21 + 0x39d);
            if ((*(char *)((long)t + 2) == '\0') ||
               (*(byte *)((long)t + (ulong)bVar1 * 0x21 + 0x388) < *(byte *)((long)t + 2))) {
              *(undefined1 *)((long)t + 2) = *(undefined1 *)((long)t + (ulong)bVar1 * 0x21 + 0x388);
            }
            pbVar3 = pbStack_40 + 10;
            *(byte *)((long)t + (ulong)bVar1 * 0x21 + 0x39e) = pbStack_40[9];
            *(undefined1 *)((long)t + (ulong)bVar1 * 0x21 + 0x38a) =
                 *(undefined1 *)((long)t + (ulong)bVar1 * 0x21 + 0x39e);
            pbStack_40 = pbStack_40 + 0xb;
            *(byte *)((long)t + (ulong)bVar1 * 0x21 + 0x39f) = *pbVar3;
          }
          else if (bVar1 == 0xa1) {
            bVar1 = *pbStack_40;
            *(byte *)((long)t + (ulong)bVar1 * 0x21 + 0x3a0) = bVar1;
            *(char *)((long)t + (ulong)bVar1 * 0x21 + 0x3a1) = (char)((int)(uint)pbStack_40[1] >> 4)
            ;
            *(byte *)((long)t + (ulong)bVar1 * 0x21 + 0x3a2) = pbStack_40[1] & 0xf;
            *(byte *)((long)t + (ulong)bVar1 * 0x21 + 0x3a3) = pbStack_40[4];
            *(byte *)((long)t + (ulong)bVar1 * 0x21 + 0x3a4) = pbStack_40[5];
            *(byte *)((long)t + (ulong)bVar1 * 0x21 + 0x3a5) = pbStack_40[6];
            *(byte *)((long)t + (ulong)bVar1 * 0x21 + 0x3a6) = pbStack_40[8];
            *(undefined1 *)((long)t + (ulong)bVar1 * 0x21 + 0x389) =
                 *(undefined1 *)((long)t + (ulong)bVar1 * 0x21 + 0x3a6);
            if ((*(char *)((long)t + 3) == '\0') ||
               (*(byte *)((long)t + 3) < *(byte *)((long)t + (ulong)bVar1 * 0x21 + 0x389))) {
              *(undefined1 *)((long)t + 3) = *(undefined1 *)((long)t + (ulong)bVar1 * 0x21 + 0x389);
            }
            pbVar3 = pbStack_40 + 10;
            *(byte *)((long)t + (ulong)bVar1 * 0x21 + 0x3a7) = pbStack_40[9];
            pbStack_40 = pbStack_40 + 0xb;
            *(byte *)((long)t + (ulong)bVar1 * 0x21 + 0x3a8) = *pbVar3;
          }
          else if (bVar1 == 0xa2) {
            bVar1 = *pbStack_40;
            *(byte *)((long)t + (ulong)bVar1 * 0x21 + 0x38e) = bVar1;
            *(char *)((long)t + (ulong)bVar1 * 0x21 + 0x38f) = (char)((int)(uint)pbStack_40[1] >> 4)
            ;
            *(byte *)((long)t + (ulong)bVar1 * 0x21 + 0x390) = pbStack_40[1] & 0xf;
            *(byte *)((long)t + (ulong)bVar1 * 0x21 + 0x391) = pbStack_40[4];
            *(byte *)((long)t + (ulong)bVar1 * 0x21 + 0x392) = pbStack_40[5];
            *(byte *)((long)t + (ulong)bVar1 * 0x21 + 0x393) = pbStack_40[6];
            *(byte *)((long)t + (ulong)bVar1 * 0x21 + 0x394) = pbStack_40[8];
            pbVar3 = pbStack_40 + 10;
            *(byte *)((long)t + (ulong)bVar1 * 0x21 + 0x395) = pbStack_40[9];
            pbStack_40 = pbStack_40 + 0xb;
            *(byte *)((long)t + (ulong)bVar1 * 0x21 + 0x396) = *pbVar3;
            *(undefined2 *)((long)t + (ulong)bVar1 * 0x21 + 0x38b) =
                 *(undefined2 *)((long)t + (ulong)bVar1 * 0x21 + 0x394);
            *(undefined1 *)((long)t + (ulong)bVar1 * 0x21 + 0x38d) =
                 *(undefined1 *)((long)t + (ulong)bVar1 * 0x21 + 0x396);
          }
        }
      }
      t_local._4_4_ = 0;
    }
    else {
      t_local._4_4_ = 7;
    }
  }
  return t_local._4_4_;
}

Assistant:

int cueify_full_toc_deserialize(cueify_full_toc *t,
				const uint8_t * const buffer,
				size_t size) {
    cueify_full_toc_private *toc = (cueify_full_toc_private *)t;
    uint16_t toc_length;
    const uint8_t *bp;
    uint8_t offset;

    if (t == NULL || buffer == NULL) {
	return CUEIFY_ERR_BADARG;
    }
    if (size < 4) {
	return CUEIFY_ERR_TRUNCATED;
    }

    /* TOC Data Length */
    toc_length = ((buffer[0] << 8) | buffer[1]);
    if (size - 2 < toc_length) {
	return CUEIFY_ERR_TRUNCATED;
    }
    if ((toc_length - 2) % 11 != 0) {
	return CUEIFY_ERR_CORRUPTED;
    }

    memset(toc, 0, sizeof(cueify_full_toc_private));

    /* First Complete Session Number */
    toc->first_session_number = buffer[2];
    /* Last Complete Session Number */
    toc->last_session_number = buffer[3];

    toc->first_track_number = toc->last_track_number = 0;

    /* TOC Track Descriptor(s) */
    bp = buffer + 4;
    while (bp < buffer + toc_length + 2) {
	if ((bp[1] >> 4) == 0x05) {
	    /* Ignore extra ATIP/Interval data */
	    bp += 11;
	    continue;
	}
	/* Track Number */
	offset = bp[3];
	if (offset < MAX_TRACKS) {
	    /* standard track */
	    /* Session Number */
	    toc->tracks[offset].session = *bp++;
	    /* ADR */
	    toc->tracks[offset].adr = *bp >> 4;
	    /* CONTROL */
	    toc->tracks[offset].control = *bp & 0xF;
	    bp++;
	    /* TNO */
	    bp++;
	    /* POINT */
	    bp++;
	    /* Min */
	    toc->tracks[offset].atime.min = *bp++;
	    /* Sec */
	    toc->tracks[offset].atime.sec = *bp++;
	    /* Frame */
	    toc->tracks[offset].atime.frm = *bp++;
	    /* Zero */
	    bp++;
	    /* PMIN */
	    toc->tracks[offset].offset.min = *bp++;
	    /* PSEC */
	    toc->tracks[offset].offset.sec = *bp++;
	    /* PFRAME */
	    toc->tracks[offset].offset.frm = *bp++;
	} else if (offset == 0xA0) {
	    /* POINT == 0xA0 */
	    offset = *bp++;
	    /* Session Number */
	    toc->sessions[offset].pseudotracks[1].session = offset;
	    /* ADR */
	    toc->sessions[offset].pseudotracks[1].adr = *bp >> 4;
	    /* CONTROL */
	    toc->sessions[offset].pseudotracks[1].control = *bp & 0xF;
	    bp++;
	    /* TNO */
	    bp++;
	    /* POINT */
	    bp++;
	    /* Min */
	    toc->sessions[offset].pseudotracks[1].atime.min = *bp++;
	    /* Sec */
	    toc->sessions[offset].pseudotracks[1].atime.sec = *bp++;
	    /* Frame */
	    toc->sessions[offset].pseudotracks[1].atime.frm = *bp++;
	    /* Zero */
	    bp++;
	    /* PMIN == First Track Number */
	    toc->sessions[offset].pseudotracks[1].offset.min = *bp++;
	    toc->sessions[offset].first_track_number =
		toc->sessions[offset].pseudotracks[1].offset.min;
	    if (toc->first_track_number == 0 ||
		toc->sessions[offset].first_track_number <
		toc->first_track_number) {
		toc->first_track_number =
		    toc->sessions[offset].first_track_number;
	    }
	    /* PSEC == Disc Type */
	    toc->sessions[offset].pseudotracks[1].offset.sec = *bp++;
	    toc->sessions[offset].session_type =
		toc->sessions[offset].pseudotracks[1].offset.sec;
	    /* PFRAME == Reserved */
	    toc->sessions[offset].pseudotracks[1].offset.frm = *bp++;
	} else if (offset == 0xA1) {
	    /* POINT == 0xA1 */
	    offset = *bp++;
	    /* Session Number */
	    toc->sessions[offset].pseudotracks[2].session = offset;
	    /* ADR */
	    toc->sessions[offset].pseudotracks[2].adr = *bp >> 4;
	    /* CONTROL */
	    toc->sessions[offset].pseudotracks[2].control = *bp & 0xF;
	    bp++;
	    /* TNO */
	    bp++;
	    /* POINT */
	    bp++;
	    /* Min */
	    toc->sessions[offset].pseudotracks[2].atime.min = *bp++;
	    /* Sec */
	    toc->sessions[offset].pseudotracks[2].atime.sec = *bp++;
	    /* Frame */
	    toc->sessions[offset].pseudotracks[2].atime.frm = *bp++;
	    /* Zero */
	    bp++;
	    /* PMIN == Last Track Number */
	    toc->sessions[offset].pseudotracks[2].offset.min = *bp++;
	    toc->sessions[offset].last_track_number =
		toc->sessions[offset].pseudotracks[2].offset.min;
	    if (toc->last_track_number == 0 ||
		toc->sessions[offset].last_track_number >
		toc->last_track_number) {
		toc->last_track_number =
		    toc->sessions[offset].last_track_number;
	    }
	    /* PSEC == Reserved */
	    toc->sessions[offset].pseudotracks[2].offset.sec = *bp++;
	    /* PFRAME == Reserved */
	    toc->sessions[offset].pseudotracks[2].offset.frm = *bp++;
	} else if (offset == 0xA2) {
	    /* POINT == 0xA2 */
	    /* Session Number */
	    offset = *bp++;
	    /* Session Number */
	    toc->sessions[offset].pseudotracks[0].session = offset;
	    /* ADR */
	    toc->sessions[offset].pseudotracks[0].adr = *bp >> 4;
	    /* CONTROL */
	    toc->sessions[offset].pseudotracks[0].control = *bp & 0xF;
	    bp++;
	    /* TNO */
	    bp++;
	    /* POINT */
	    bp++;
	    /* Min */
	    toc->sessions[offset].pseudotracks[0].atime.min = *bp++;
	    /* Sec */
	    toc->sessions[offset].pseudotracks[0].atime.sec = *bp++;
	    /* Frame */
	    toc->sessions[offset].pseudotracks[0].atime.frm = *bp++;
	    /* Zero */
	    bp++;
	    /* PMIN */
	    toc->sessions[offset].pseudotracks[0].offset.min = *bp++;
	    /* PSEC */
	    toc->sessions[offset].pseudotracks[0].offset.sec = *bp++;
	    /* PFRAME */
	    toc->sessions[offset].pseudotracks[0].offset.frm = *bp++;
	    toc->sessions[offset].leadout =
		toc->sessions[offset].pseudotracks[0].offset;
	}
    }

    return CUEIFY_OK;
}